

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.h
# Opt level: O1

void __thiscall TreeNode::addElement(TreeNode *this,QString *filepath,VCFilterFile *allInfo)

{
  QMapData<std::map<QString,_TreeNode_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_TreeNode_*>_>_>_>
  *pQVar1;
  TreeNode *pTVar2;
  Data *pDVar3;
  qsizetype qVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  int iVar7;
  const_iterator cVar8;
  _Base_ptr *pp_Var9;
  long in_FS_OFFSET;
  TreeNode *n;
  TreeNode *local_70;
  QString local_68;
  key_type local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.d = (filepath->d).d;
  local_48.d.ptr = (filepath->d).ptr;
  local_48.d.size = (filepath->d).size;
  if ((_Base_ptr)local_48.d.d != (_Base_ptr)0x0) {
    LOCK();
    (((QArrayData *)&((_Base_ptr)local_48.d.d)->_M_color)->ref_)._q_value.super___atomic_base<int>.
    _M_i = (((QArrayData *)&((_Base_ptr)local_48.d.d)->_M_color)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  iVar7 = pathIndex(this,filepath);
  if (iVar7 != -1) {
    QString::left(&local_68,filepath,(long)iVar7);
    pcVar6 = local_48.d.ptr;
    pDVar5 = local_48.d.d;
    qVar4 = local_68.d.size;
    pDVar3 = local_68.d.d;
    local_68.d.d = local_48.d.d;
    local_48.d.d = pDVar3;
    local_48.d.ptr = local_68.d.ptr;
    local_68.d.ptr = pcVar6;
    local_68.d.size = local_48.d.size;
    local_48.d.size = qVar4;
    if ((_Base_ptr)pDVar5 != (_Base_ptr)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
      }
    }
  }
  local_68.d.d = (Data *)0x0;
  pQVar1 = (this->children).d.d.ptr;
  if (pQVar1 == (QMapData<std::map<QString,_TreeNode_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_TreeNode_*>_>_>_>
                 *)0x0) {
    pp_Var9 = (_Base_ptr *)&local_68;
  }
  else {
    cVar8 = std::
            _Rb_tree<QString,_std::pair<const_QString,_TreeNode_*>,_std::_Select1st<std::pair<const_QString,_TreeNode_*>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_TreeNode_*>_>_>
            ::find(&(pQVar1->m)._M_t,&local_48);
    pp_Var9 = (_Base_ptr *)&local_68;
    if ((_Rb_tree_header *)cVar8._M_node !=
        &(((this->children).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
      pp_Var9 = &cVar8._M_node[1]._M_right;
    }
  }
  local_70 = (TreeNode *)*pp_Var9;
  if (local_70 == (TreeNode *)0x0) {
    local_70 = (TreeNode *)operator_new(0x30);
    (local_70->super_Node)._vptr_Node = (_func_int **)&PTR__TreeNode_002dfd68;
    (local_70->info).excludeFromBuild = false;
    (local_70->info).file.d.d = (Data *)0x0;
    (local_70->info).file.d.ptr = (char16_t *)0x0;
    (local_70->info).file.d.size = 0;
    (local_70->children).d.d.ptr =
         (QMapData<std::map<QString,_TreeNode_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_TreeNode_*>_>_>_>
          *)0x0;
    (local_70->info).excludeFromBuild = allInfo->excludeFromBuild;
    QString::operator=(&(local_70->info).file,(QString *)&allInfo->file);
    QMap<QString,_TreeNode_*>::insert(&this->children,&local_48,&local_70);
  }
  pTVar2 = local_70;
  if (iVar7 != -1) {
    QString::mid((longlong)&local_68,(longlong)filepath);
    (*(pTVar2->super_Node)._vptr_Node[2])(pTVar2,&local_68,allInfo);
    if ((_Base_ptr)local_68.d.d != (_Base_ptr)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((_Base_ptr)local_48.d.d != (_Base_ptr)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void addElement(const QString &filepath, const VCFilterFile &allInfo) override {
        QString newNodeName(filepath);

        int index = pathIndex(filepath);
        if (index != -1)
            newNodeName = filepath.left(index);

        TreeNode *n = children.value(newNodeName);
        if (!n) {
            n = new TreeNode;
            n->info = allInfo;
            children.insert(newNodeName, n);
        }
        if (index != -1)
            n->addElement(filepath.mid(index+1), allInfo);
    }